

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Functions.cpp
# Opt level: O2

string_view translateCharacter(string_view object)

{
  size_t sVar1;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  basic_string_view<char,_std::char_traits<char>_> __x_09;
  basic_string_view<char,_std::char_traits<char>_> __x_10;
  basic_string_view<char,_std::char_traits<char>_> __x_11;
  basic_string_view<char,_std::char_traits<char>_> __x_12;
  basic_string_view<char,_std::char_traits<char>_> __x_13;
  basic_string_view<char,_std::char_traits<char>_> __x_14;
  basic_string_view<char,_std::char_traits<char>_> __x_15;
  basic_string_view<char,_std::char_traits<char>_> __x_16;
  basic_string_view<char,_std::char_traits<char>_> __x_17;
  basic_string_view<char,_std::char_traits<char>_> __x_18;
  basic_string_view<char,_std::char_traits<char>_> __x_19;
  basic_string_view<char,_std::char_traits<char>_> __x_20;
  basic_string_view<char,_std::char_traits<char>_> __x_21;
  basic_string_view<char,_std::char_traits<char>_> __x_22;
  basic_string_view<char,_std::char_traits<char>_> __x_23;
  basic_string_view<char,_std::char_traits<char>_> __x_24;
  bool bVar2;
  size_type sVar3;
  char *pcVar4;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __y_02;
  basic_string_view<char,_std::char_traits<char>_> __y_03;
  basic_string_view<char,_std::char_traits<char>_> __y_04;
  basic_string_view<char,_std::char_traits<char>_> __y_05;
  basic_string_view<char,_std::char_traits<char>_> __y_06;
  basic_string_view<char,_std::char_traits<char>_> __y_07;
  basic_string_view<char,_std::char_traits<char>_> __y_08;
  basic_string_view<char,_std::char_traits<char>_> __y_09;
  basic_string_view<char,_std::char_traits<char>_> __y_10;
  basic_string_view<char,_std::char_traits<char>_> __y_11;
  basic_string_view<char,_std::char_traits<char>_> __y_12;
  basic_string_view<char,_std::char_traits<char>_> __y_13;
  basic_string_view<char,_std::char_traits<char>_> __y_14;
  basic_string_view<char,_std::char_traits<char>_> __y_15;
  basic_string_view<char,_std::char_traits<char>_> __y_16;
  basic_string_view<char,_std::char_traits<char>_> __y_17;
  basic_string_view<char,_std::char_traits<char>_> __y_18;
  basic_string_view<char,_std::char_traits<char>_> __y_19;
  basic_string_view<char,_std::char_traits<char>_> __y_20;
  basic_string_view<char,_std::char_traits<char>_> __y_21;
  basic_string_view<char,_std::char_traits<char>_> __y_22;
  basic_string_view<char,_std::char_traits<char>_> __y_23;
  basic_string_view<char,_std::char_traits<char>_> __y_24;
  basic_string_view<char,_std::char_traits<char>_> __y_25;
  basic_string_view<char,_std::char_traits<char>_> __y_26;
  basic_string_view<char,_std::char_traits<char>_> __y_27;
  basic_string_view<char,_std::char_traits<char>_> __x_25;
  basic_string_view<char,_std::char_traits<char>_> __x_26;
  basic_string_view<char,_std::char_traits<char>_> __x_27;
  string_view sVar5;
  size_t sStack_40;
  string_view object_local;
  
  object_local._M_str = object._M_str;
  object_local._M_len = object._M_len;
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find(&object_local,"GDI_",0,4);
  if (sVar3 == 0) {
    __x_25._M_str = object_local._M_str + 4;
    __x_25._M_len = object_local._M_len - 4;
    pcVar4 = "Deadeye";
    __y._M_str = "Deadeye";
    __y._M_len = 7;
    object_local._M_len = __x_25._M_len;
    object_local._M_str = __x_25._M_str;
    bVar2 = std::operator==(__x_25,__y);
    sStack_40 = 7;
    if (bVar2) goto LAB_0012dfc0;
    __x._M_str = object_local._M_str;
    __x._M_len = object_local._M_len;
    __y_00._M_str = "Engineer";
    __y_00._M_len = 8;
    bVar2 = std::operator==(__x,__y_00);
    if (bVar2) {
      pcVar4 = "GDI Engineer";
      sStack_40 = 0xc;
      goto LAB_0012dfc0;
    }
    __x_01._M_str = object_local._M_str;
    __x_01._M_len = object_local._M_len;
    pcVar4 = "Grenadier";
    __y_03._M_str = "Grenadier";
    __y_03._M_len = 9;
    bVar2 = std::operator==(__x_01,__y_03);
    sStack_40 = 9;
    if (bVar2) goto LAB_0012dfc0;
    __x_02._M_str = object_local._M_str;
    __x_02._M_len = object_local._M_len;
    pcVar4 = "Gunner";
    __y_04._M_str = "Gunner";
    __y_04._M_len = 6;
    bVar2 = std::operator==(__x_02,__y_04);
    sStack_40 = 6;
    if (bVar2) goto LAB_0012dfc0;
    __x_03._M_str = object_local._M_str;
    __x_03._M_len = object_local._M_len;
    pcVar4 = "Havoc";
    __y_05._M_str = "Havoc";
    __y_05._M_len = 5;
    bVar2 = std::operator==(__x_03,__y_05);
    sStack_40 = 5;
    if (bVar2) goto LAB_0012dfc0;
    __x_04._M_str = object_local._M_str;
    __x_04._M_len = object_local._M_len;
    pcVar4 = "Hotwire";
    __y_06._M_str = "Hotwire";
    __y_06._M_len = 7;
    bVar2 = std::operator==(__x_04,__y_06);
    sStack_40 = 7;
    if (bVar2) goto LAB_0012dfc0;
    __x_05._M_str = object_local._M_str;
    __x_05._M_len = object_local._M_len;
    __y_07._M_str = "Marksman";
    __y_07._M_len = 8;
    bVar2 = std::operator==(__x_05,__y_07);
    if (bVar2) {
      pcVar4 = "GDI Marksman";
      sStack_40 = 0xc;
      goto LAB_0012dfc0;
    }
    __x_12._M_str = object_local._M_str;
    __x_12._M_len = object_local._M_len;
    pcVar4 = "McFarland";
    __y_14._M_str = "McFarland";
    __y_14._M_len = 9;
    bVar2 = std::operator==(__x_12,__y_14);
    sStack_40 = 9;
    if (bVar2) goto LAB_0012dfc0;
    __x_13._M_str = object_local._M_str;
    __x_13._M_len = object_local._M_len;
    pcVar4 = "Mobius";
    __y_15._M_str = "Mobius";
    __y_15._M_len = 6;
    bVar2 = std::operator==(__x_13,__y_15);
    sStack_40 = 6;
    if (bVar2) goto LAB_0012dfc0;
    __x_14._M_str = object_local._M_str;
    __x_14._M_len = object_local._M_len;
    __y_16._M_str = "Officer";
    __y_16._M_len = 7;
    bVar2 = std::operator==(__x_14,__y_16);
    sStack_40 = 0xb;
    if (bVar2) {
      pcVar4 = "GDI Officer";
      sStack_40 = sStack_40;
      goto LAB_0012dfc0;
    }
    __x_17._M_str = object_local._M_str;
    __x_17._M_len = object_local._M_len;
    pcVar4 = "Patch";
    __y_19._M_str = "Patch";
    __y_19._M_len = 5;
    bVar2 = std::operator==(__x_17,__y_19);
    sStack_40 = 5;
    if (bVar2) goto LAB_0012dfc0;
    __x_18._M_str = object_local._M_str;
    __x_18._M_len = object_local._M_len;
    __y_20._M_str = "RocketSoldier";
    __y_20._M_len = 0xd;
    bVar2 = std::operator==(__x_18,__y_20);
    if (bVar2) {
      pcVar4 = "GDI Rocket Soldier";
      sStack_40 = 0x12;
      goto LAB_0012dfc0;
    }
    __x_21._M_str = object_local._M_str;
    __x_21._M_len = object_local._M_len;
    __y_23._M_str = "Shotgunner";
    __y_23._M_len = 10;
    bVar2 = std::operator==(__x_21,__y_23);
    if (bVar2) {
      pcVar4 = "GDI Shotgunner";
      goto LAB_0012e209;
    }
    __x_23._M_str = object_local._M_str;
    __x_23._M_len = object_local._M_len;
    __y_25._M_str = "Soldier";
    __y_25._M_len = 7;
    bVar2 = std::operator==(__x_23,__y_25);
    if (bVar2) {
      pcVar4 = "GDI Soldier";
      sStack_40 = 0xb;
      goto LAB_0012dfc0;
    }
    pcVar4 = "Sydney";
    sStack_40 = 6;
LAB_0012e2ad:
    __y_27._M_str = pcVar4;
    __y_27._M_len = sStack_40;
    __x_27._M_str = object_local._M_str;
    __x_27._M_len = object_local._M_len;
    bVar2 = std::operator==(__x_27,__y_27);
    if (bVar2) goto LAB_0012dfc0;
  }
  else {
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find(&object_local,"Nod_",0,4);
    if (sVar3 == 0) {
      __x_26._M_str = object_local._M_str + 4;
      __x_26._M_len = object_local._M_len - 4;
      __y_01._M_str = "BlackHandSniper";
      __y_01._M_len = 0xf;
      object_local._M_len = __x_26._M_len;
      object_local._M_str = __x_26._M_str;
      bVar2 = std::operator==(__x_26,__y_01);
      if (bVar2) {
        pcVar4 = "Black Hand Sniper";
        sStack_40 = 0x11;
        goto LAB_0012dfc0;
      }
      __x_00._M_str = object_local._M_str;
      __x_00._M_len = object_local._M_len;
      __y_02._M_str = "ChemicalTrooper";
      __y_02._M_len = 0xf;
      bVar2 = std::operator==(__x_00,__y_02);
      if (bVar2) {
        pcVar4 = "Chemical Trooper";
        sStack_40 = 0x10;
        goto LAB_0012dfc0;
      }
      __x_06._M_str = object_local._M_str;
      __x_06._M_len = object_local._M_len;
      __y_08._M_str = "Engineer";
      __y_08._M_len = 8;
      bVar2 = std::operator==(__x_06,__y_08);
      if (bVar2) {
        pcVar4 = "Nod Engineer";
        sStack_40 = 0xc;
        goto LAB_0012dfc0;
      }
      __x_07._M_str = object_local._M_str;
      __x_07._M_len = object_local._M_len;
      __y_09._M_str = "FlameTrooper";
      __y_09._M_len = 0xc;
      bVar2 = std::operator==(__x_07,__y_09);
      if (bVar2) {
        pcVar4 = "Flame Trooper";
        sStack_40 = 0xd;
        goto LAB_0012dfc0;
      }
      __x_08._M_str = object_local._M_str;
      __x_08._M_len = object_local._M_len;
      __y_10._M_str = "LaserChainGunner";
      __y_10._M_len = 0x10;
      bVar2 = std::operator==(__x_08,__y_10);
      sVar1 = 0x12;
      if (bVar2) {
        pcVar4 = "Laser Chain Gunner";
        sStack_40 = sVar1;
        goto LAB_0012dfc0;
      }
      __x_09._M_str = object_local._M_str;
      __x_09._M_len = object_local._M_len;
      __y_11._M_str = "Marksman";
      __y_11._M_len = 8;
      bVar2 = std::operator==(__x_09,__y_11);
      if (bVar2) {
        pcVar4 = "Nod Marksman";
        sStack_40 = 0xc;
        goto LAB_0012dfc0;
      }
      __x_10._M_str = object_local._M_str;
      __x_10._M_len = object_local._M_len;
      pcVar4 = "Mendoza";
      __y_12._M_str = "Mendoza";
      __y_12._M_len = 7;
      bVar2 = std::operator==(__x_10,__y_12);
      sStack_40 = 7;
      if (bVar2) goto LAB_0012dfc0;
      __x_11._M_str = object_local._M_str;
      __x_11._M_len = object_local._M_len;
      __y_13._M_str = "Officer";
      __y_13._M_len = 7;
      bVar2 = std::operator==(__x_11,__y_13);
      if (bVar2) {
        pcVar4 = "Nod Officer";
        sStack_40 = 0xb;
        goto LAB_0012dfc0;
      }
      __x_15._M_str = object_local._M_str;
      __x_15._M_len = object_local._M_len;
      pcVar4 = "Raveshaw";
      __y_17._M_str = "Raveshaw";
      __y_17._M_len = 8;
      bVar2 = std::operator==(__x_15,__y_17);
      sStack_40 = 8;
      if (bVar2) goto LAB_0012dfc0;
      __x_16._M_str = object_local._M_str;
      __x_16._M_len = object_local._M_len;
      __y_18._M_str = "RocketSoldier";
      __y_18._M_len = 0xd;
      bVar2 = std::operator==(__x_16,__y_18);
      if (bVar2) {
        pcVar4 = "Nod Rocket Soldier";
        sStack_40 = sVar1;
        goto LAB_0012dfc0;
      }
      __x_19._M_str = object_local._M_str;
      __x_19._M_len = object_local._M_len;
      pcVar4 = "Sakura";
      __y_21._M_str = "Sakura";
      __y_21._M_len = 6;
      bVar2 = std::operator==(__x_19,__y_21);
      sStack_40 = 6;
      if (bVar2) goto LAB_0012dfc0;
      __x_20._M_str = object_local._M_str;
      __x_20._M_len = object_local._M_len;
      sStack_40 = 10;
      __y_22._M_str = "Shotgunner";
      __y_22._M_len = 10;
      bVar2 = std::operator==(__x_20,__y_22);
      if (bVar2) {
        pcVar4 = "Nod Shotgunner";
LAB_0012e209:
        sStack_40 = 0xe;
        goto LAB_0012dfc0;
      }
      __x_22._M_str = object_local._M_str;
      __x_22._M_len = object_local._M_len;
      __y_24._M_str = "Soldier";
      __y_24._M_len = 7;
      bVar2 = std::operator==(__x_22,__y_24);
      if (bVar2) {
        pcVar4 = "Nod Soldier";
        sStack_40 = 0xb;
        goto LAB_0012dfc0;
      }
      __x_24._M_str = object_local._M_str;
      __x_24._M_len = object_local._M_len;
      __y_26._M_str = "StealthBlackHand";
      __y_26._M_len = 0x10;
      bVar2 = std::operator==(__x_24,__y_26);
      if (bVar2) {
        pcVar4 = "Stealth Black Hand";
        sStack_40 = sVar1;
        goto LAB_0012dfc0;
      }
      pcVar4 = "Technician";
      goto LAB_0012e2ad;
    }
  }
  sStack_40 = object_local._M_len;
  pcVar4 = object_local._M_str;
LAB_0012dfc0:
  sVar5._M_str = pcVar4;
  sVar5._M_len = sStack_40;
  return sVar5;
}

Assistant:

std::string_view translateCharacter(std::string_view object)
{
	if (object.find("GDI_"sv) == 0)
	{
		object.remove_prefix(4);
		if (object == "Deadeye"sv) return translated_GDI_Deadeye;
		if (object == "Engineer"sv) return translated_GDI_Engineer;
		if (object == "Grenadier"sv) return translated_GDI_Grenadier;
		if (object == "Gunner"sv) return translated_GDI_Gunner;
		if (object == "Havoc"sv) return translated_GDI_Havoc;
		if (object == "Hotwire"sv) return translated_GDI_Hotwire;
		if (object == "Marksman"sv) return translated_GDI_Marksman;
		if (object == "McFarland"sv) return translated_GDI_McFarland;
		if (object == "Mobius"sv) return translated_GDI_Mobius;
		if (object == "Officer"sv) return translated_GDI_Officer;
		if (object == "Patch"sv) return translated_GDI_Patch;
		if (object == "RocketSoldier"sv) return translated_GDI_RocketSoldier;
		if (object == "Shotgunner"sv) return translated_GDI_Shotgunner;
		if (object == "Soldier"sv) return translated_GDI_Soldier;
		if (object == "Sydney"sv) return translated_GDI_Sydney;
	}
	else if (object.find("Nod_"sv) == 0)
	{
		object.remove_prefix(4);
		if (object == "BlackHandSniper"sv) return translated_Nod_BlackHandSniper;
		if (object == "ChemicalTrooper"sv) return translated_Nod_ChemicalTrooper;
		if (object == "Engineer"sv) return translated_Nod_Engineer;
		if (object == "FlameTrooper"sv) return translated_Nod_FlameTrooper;
		if (object == "LaserChainGunner"sv) return translated_Nod_LaserChainGunner;
		if (object == "Marksman"sv) return translated_Nod_Marksman;
		if (object == "Mendoza"sv) return translated_Nod_Mendoza;
		if (object == "Officer"sv) return translated_Nod_Officer;
		if (object == "Raveshaw"sv) return translated_Nod_Raveshaw;
		if (object == "RocketSoldier"sv) return translated_Nod_RocketSoldier;
		if (object == "Sakura"sv) return translated_Nod_Sakura;
		if (object == "Shotgunner"sv) return translated_Nod_Shotgunner;
		if (object == "Soldier"sv) return translated_Nod_Soldier;
		if (object == "StealthBlackHand"sv) return translated_Nod_StealthBlackHand;
		if (object == "Technician"sv) return translated_Nod_Technician;
	}

	return object;
}